

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void duckdb::BaseModeFunction<duckdb::ModeStandard<unsigned_char>>::
     Combine<duckdb::ModeState<unsigned_char,duckdb::ModeStandard<unsigned_char>>,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_char>>>
               (ModeState<unsigned_char,_duckdb::ModeStandard<unsigned_char>_> *source,
               ModeState<unsigned_char,_duckdb::ModeStandard<unsigned_char>_> *target,
               AggregateInputData *param_3)

{
  _Hashtable<unsigned_char,_std::pair<const_unsigned_char,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_char,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *__ht;
  mapped_type *pmVar1;
  _Hashtable<unsigned_char,_std::pair<const_unsigned_char,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_char,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  _Hash_node_base _Var2;
  __node_base *p_Var3;
  
  __ht = &source->frequency_map->_M_h;
  if (__ht != (_Hashtable<unsigned_char,_std::pair<const_unsigned_char,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_char,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)0x0) {
    if (target->frequency_map == (Counts *)0x0) {
      this = (_Hashtable<unsigned_char,_std::pair<const_unsigned_char,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_char,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)operator_new(0x38);
      std::
      _Hashtable<unsigned_char,_std::pair<const_unsigned_char,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_char,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_Hashtable(this,__ht);
      target->frequency_map = (Counts *)this;
      target->count = source->count;
    }
    else {
      p_Var3 = &__ht->_M_before_begin;
      while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
        pmVar1 = std::__detail::
                 _Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_char,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_char,_std::pair<const_unsigned_char,_duckdb::ModeAttr>,_std::allocator<std::pair<const_unsigned_char,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_char>,_std::hash<unsigned_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)target->frequency_map,(key_type *)(p_Var3 + 1));
        pmVar1->count =
             (long)&(*(_Hash_node_base **)
                      &((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor)->_M_nxt +
             pmVar1->count;
        _Var2._M_nxt = p_Var3[3]._M_nxt;
        if ((_Hash_node_base *)pmVar1->first_row < p_Var3[3]._M_nxt) {
          _Var2._M_nxt = (_Hash_node_base *)pmVar1->first_row;
        }
        pmVar1->first_row = (idx_t)_Var2._M_nxt;
      }
      target->count = target->count + source->count;
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.frequency_map) {
			return;
		}
		if (!target.frequency_map) {
			// Copy - don't destroy! Otherwise windowing will break.
			target.frequency_map = new typename STATE::Counts(*source.frequency_map);
			target.count = source.count;
			return;
		}
		for (auto &val : *source.frequency_map) {
			auto &i = (*target.frequency_map)[val.first];
			i.count += val.second.count;
			i.first_row = MinValue(i.first_row, val.second.first_row);
		}
		target.count += source.count;
	}